

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::LineRenderCase::genGeometrySource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  byte bVar1;
  char *pcVar2;
  long lVar3;
  ostringstream buf;
  ostringstream aoStack_198 [112];
  ios_base local_128 [264];
  
  bVar1 = *(byte *)((long)this + 0x80);
  pcVar2 = "vtx_color";
  if (bVar1 != 0) {
    pcVar2 = "tess_color";
  }
  std::__cxx11::ostringstream::ostringstream(aoStack_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_198,
             "${GLSL_VERSION_DECL}\n${GEOMETRY_SHADER_REQUIRE}\nlayout(lines) in;\nlayout(max_vertices=5, line_strip) out;\n\nin highp vec4 "
             ,0x79);
  lVar3 = (ulong)bVar1 + 9;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_198,pcVar2,lVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_198,
             "[2];\nout highp vec4 geo_color;\nuniform highp vec4 u_posScale;\n\n\nflat in highp float v_geo_bbox_expansionSize[2];\nflat in highp vec3 v_geo_bbox_clipMin[2];\nflat in highp vec3 v_geo_bbox_clipMax[2];\nflat out highp vec3 v_bbox_clipMin;\nflat out highp vec3 v_bbox_clipMax;\nflat out highp float v_bbox_expansionSize;\n"
             ,0x138);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_198,
             "vec4 mirrorX(in highp vec4 p)\n{\n\thighp vec2 patternOffset = u_posScale.xy;\n\thighp vec2 patternScale = u_posScale.zw;\n\thighp vec2 patternCenter = patternOffset + patternScale * 0.5;\n\treturn vec4(2.0 * patternCenter.x - p.x, p.y, p.z, p.w);\n}\n"
             ,0xf1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_198,
             "\nvoid setVisualizationVaryings()\n{\n\tv_bbox_expansionSize = v_geo_bbox_expansionSize[0];\n\tv_bbox_clipMin = v_geo_bbox_clipMin[0];\n\tv_bbox_clipMax = v_geo_bbox_clipMax[0];\n}\nvoid main()\n{\n\t// Non-trivial geometry shader: 1-to-3 amplification, mirror horizontally\n\thighp vec4 p0 = mirrorX(gl_in[0].gl_Position);\n\thighp vec4 p1 = mirrorX(gl_in[1].gl_Position);\n\thighp vec4 lineColor = "
             ,0x17d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_198,pcVar2,lVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_198,
             "[0];\n\n\t// output two separate primitives, just in case\n\tgl_Position = mix(p0, p1, 0.00); geo_color = lineColor; setVisualizationVaryings(); EmitVertex();\n\tgl_Position = mix(p0, p1, 0.33); geo_color = lineColor; setVisualizationVaryings(); EmitVertex();\n\tEndPrimitive();\n\n\tgl_Position = mix(p0, p1, 0.33); geo_color = lineColor; setVisualizationVaryings(); EmitVertex();\n\tgl_Position = mix(p0, p1, 0.67); geo_color = lineColor; setVisualizationVaryings(); EmitVertex();\n\tgl_Position = mix(p0, p1, 1.00); geo_color = lineColor; setVisualizationVaryings(); EmitVertex();\n\tEndPrimitive();\n}\n"
             ,0x24b);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string LineRenderCase::genGeometrySource (void) const
{
	const char* const	colorInputName = (m_hasTessellationStage) ? ("tess_color") : ("vtx_color");
	std::ostringstream	buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"${GEOMETRY_SHADER_REQUIRE}\n"
			"layout(lines) in;\n"
			"layout(max_vertices=5, line_strip) out;\n"
			"\n"
			"in highp vec4 " << colorInputName << "[2];\n"
			"out highp vec4 geo_color;\n"
			"uniform highp vec4 u_posScale;\n"
			"\n"
			"\n"
			"flat in highp float v_geo_bbox_expansionSize[2];\n"
			"flat in highp vec3 v_geo_bbox_clipMin[2];\n"
			"flat in highp vec3 v_geo_bbox_clipMax[2];\n"
			"flat out highp vec3 v_bbox_clipMin;\n"
			"flat out highp vec3 v_bbox_clipMax;\n"
			"flat out highp float v_bbox_expansionSize;\n"
		<<	genShaderFunction(SHADER_FUNC_MIRROR_X)
		<<	"\n"
			"void setVisualizationVaryings()\n"
			"{\n"
			"	v_bbox_expansionSize = v_geo_bbox_expansionSize[0];\n"
			"	v_bbox_clipMin = v_geo_bbox_clipMin[0];\n"
			"	v_bbox_clipMax = v_geo_bbox_clipMax[0];\n"
			"}\n"
			"void main()\n"
			"{\n"
			"	// Non-trivial geometry shader: 1-to-3 amplification, mirror horizontally\n"
			"	highp vec4 p0 = mirrorX(gl_in[0].gl_Position);\n"
			"	highp vec4 p1 = mirrorX(gl_in[1].gl_Position);\n"
			"	highp vec4 lineColor = " << colorInputName << "[0];\n"
			"\n"
			"	// output two separate primitives, just in case\n"
			"	gl_Position = mix(p0, p1, 0.00); geo_color = lineColor; setVisualizationVaryings(); EmitVertex();\n"
			"	gl_Position = mix(p0, p1, 0.33); geo_color = lineColor; setVisualizationVaryings(); EmitVertex();\n"
			"	EndPrimitive();\n"
			"\n"
			"	gl_Position = mix(p0, p1, 0.33); geo_color = lineColor; setVisualizationVaryings(); EmitVertex();\n"
			"	gl_Position = mix(p0, p1, 0.67); geo_color = lineColor; setVisualizationVaryings(); EmitVertex();\n"
			"	gl_Position = mix(p0, p1, 1.00); geo_color = lineColor; setVisualizationVaryings(); EmitVertex();\n"
			"	EndPrimitive();\n"
			"}\n";

	return buf.str();
}